

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reliveapp.cpp
# Opt level: O1

bool __thiscall relive::ReLiveApp::selectStation(ReLiveApp *this,string *name)

{
  char *pcVar1;
  size_t __n;
  ReLiveApp *pRVar2;
  int iVar3;
  ostream *poVar4;
  pointer station;
  bool bVar5;
  bool bVar6;
  double dVar7;
  ostringstream os;
  allocator<char> local_261;
  string local_260;
  ReLiveApp *local_240;
  long *local_238 [2];
  long local_228 [2];
  long *local_218 [2];
  long local_208 [2];
  string local_1f8;
  long *local_1d8;
  long local_1c8 [2];
  string *local_1b8;
  pointer local_1b0;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  local_240 = this;
  local_1b8 = name;
  if (selectStation::_isActive) {
    if (((byte)selectStation::_init._M_base._M_i & 1) == 0) {
      pcVar1 = *(char **)((this->super_Application)._vptr_Application[-1] + 8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_260,pcVar1 + (*pcVar1 == '*'),(allocator<char> *)&local_1f8);
      stripTypeName((string *)local_1a8,&local_260);
      LogManager::registerIsActive
                ((string *)local_1a8,1,&selectStation::_init,&selectStation::_isActive);
      if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260._M_dataplus._M_p != &local_260.field_2) {
        operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
      }
      if (selectStation::_isActive == false) goto LAB_001190ac;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Switching to default station \'",0x1e);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(local_1b8->_M_dataplus)._M_p,
                        local_1b8->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\'",1);
    pcVar1 = *(char **)((local_240->super_Application)._vptr_Application[-1] + 8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f8,pcVar1 + (*pcVar1 == '*'),&local_261);
    stripTypeName(&local_260,&local_1f8);
    local_218[0] = local_208;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_218,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/src/frontend/imgui/reliveapp.cpp"
               ,"");
    local_238[0] = local_228;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_238,"bool relive::ReLiveApp::selectStation(const std::string &)","");
    dVar7 = (double)std::__cxx11::stringbuf::str();
    LogManager::log(dVar7);
    if (local_1d8 != local_1c8) {
      operator_delete(local_1d8,local_1c8[0] + 1);
    }
    if (local_238[0] != local_228) {
      operator_delete(local_238[0],local_228[0] + 1);
    }
    if (local_218[0] != local_208) {
      operator_delete(local_218[0],local_208[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != &local_260.field_2) {
      operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
  }
LAB_001190ac:
  station = (local_240->_stations).
            super__Vector_base<relive::Station,_std::allocator<relive::Station>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_1b0 = (local_240->_stations).
              super__Vector_base<relive::Station,_std::allocator<relive::Station>_>._M_impl.
              super__Vector_impl_data._M_finish;
  bVar5 = station != local_1b0;
  if (bVar5) {
    do {
      if (selectStation(std::__cxx11::string_const&)::_isActive == true) {
        if (((byte)selectStation(std::__cxx11::string_const&)::_init._M_base._M_i & 1) == 0) {
          pcVar1 = *(char **)((local_240->super_Application)._vptr_Application[-1] + 8);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_260,pcVar1 + (*pcVar1 == '*'),(allocator<char> *)&local_1f8);
          stripTypeName((string *)local_1a8,&local_260);
          LogManager::registerIsActive
                    ((string *)local_1a8,2,&selectStation(std::__cxx11::string_const&)::_init,
                     &selectStation(std::__cxx11::string_const&)::_isActive);
          if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
            operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_260._M_dataplus._M_p != &local_260.field_2) {
            operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
          }
          if (selectStation(std::__cxx11::string_const&)::_isActive == false) goto LAB_00119362;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"comparing to \'",0xe);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(station->_name)._M_dataplus._M_p,
                            (station->_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\'",1);
        pcVar1 = *(char **)((local_240->super_Application)._vptr_Application[-1] + 8);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1f8,pcVar1 + (*pcVar1 == '*'),&local_261);
        stripTypeName(&local_260,&local_1f8);
        local_218[0] = local_208;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_218,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/src/frontend/imgui/reliveapp.cpp"
                   ,"");
        local_238[0] = local_228;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_238,"bool relive::ReLiveApp::selectStation(const std::string &)",
                   "");
        dVar7 = (double)std::__cxx11::stringbuf::str();
        LogManager::log(dVar7);
        if (local_1d8 != local_1c8) {
          operator_delete(local_1d8,local_1c8[0] + 1);
        }
        if (local_238[0] != local_228) {
          operator_delete(local_238[0],local_228[0] + 1);
        }
        if (local_218[0] != local_208) {
          operator_delete(local_218[0],local_208[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_260._M_dataplus._M_p != &local_260.field_2) {
          operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
          operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
      }
LAB_00119362:
      __n = (station->_name)._M_string_length;
      if (__n == local_1b8->_M_string_length) {
        if (__n == 0) {
          bVar6 = true;
        }
        else {
          iVar3 = bcmp((station->_name)._M_dataplus._M_p,(local_1b8->_M_dataplus)._M_p,__n);
          bVar6 = iVar3 == 0;
        }
      }
      else {
        bVar6 = false;
      }
      if (bVar6) {
        if (selectStation(std::__cxx11::string_const&)::_isActive == true) {
          if (((byte)selectStation(std::__cxx11::string_const&)::_init._M_base._M_i & 1) == 0) {
            pcVar1 = *(char **)((local_240->super_Application)._vptr_Application[-1] + 8);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_260,pcVar1 + (*pcVar1 == '*'),(allocator<char> *)&local_1f8)
            ;
            stripTypeName((string *)local_1a8,&local_260);
            LogManager::registerIsActive
                      ((string *)local_1a8,2,&selectStation(std::__cxx11::string_const&)::_init,
                       &selectStation(std::__cxx11::string_const&)::_isActive);
            if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
              operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_260._M_dataplus._M_p != &local_260.field_2) {
              operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1
                             );
            }
            if (selectStation(std::__cxx11::string_const&)::_isActive == false) goto LAB_00119636;
          }
          pRVar2 = local_240;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"found \'",7);
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,(station->_name)._M_dataplus._M_p,
                              (station->_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\'",1);
          pcVar1 = *(char **)((pRVar2->super_Application)._vptr_Application[-1] + 8);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1f8,pcVar1 + (*pcVar1 == '*'),&local_261);
          stripTypeName(&local_260,&local_1f8);
          local_218[0] = local_208;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_218,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/src/frontend/imgui/reliveapp.cpp"
                     ,"");
          local_238[0] = local_228;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_238,
                     "bool relive::ReLiveApp::selectStation(const std::string &)","");
          dVar7 = (double)std::__cxx11::stringbuf::str();
          LogManager::log(dVar7);
          if (local_1d8 != local_1c8) {
            operator_delete(local_1d8,local_1c8[0] + 1);
          }
          if (local_238[0] != local_228) {
            operator_delete(local_238[0],local_228[0] + 1);
          }
          if (local_218[0] != local_208) {
            operator_delete(local_218[0],local_208[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_260._M_dataplus._M_p != &local_260.field_2) {
            operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
            operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
        }
LAB_00119636:
        selectStation(local_240,station);
        if (bVar6) {
          return bVar5;
        }
      }
      station = station + 1;
      bVar5 = station != local_1b0;
    } while (bVar5);
  }
  return bVar5;
}

Assistant:

bool ReLiveApp::selectStation(const std::string& name)
{
    DEBUG_LOG(1, "Switching to default station '" << name << "'");
    for (const auto& station : _stations) {
        DEBUG_LOG(2, "comparing to '" << station._name << "'");
        if (station._name == name) {
            DEBUG_LOG(2, "found '" << station._name << "'");
            selectStation(station);
            return true;
        }
    }
    return false;
}